

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,size_t escapeOffset)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar3 = 0;
  iVar4 = 4;
  pcVar2 = is->src_;
  while( true ) {
    cVar1 = *pcVar2;
    iVar5 = -0x30;
    if (((9 < (byte)(cVar1 - 0x30U)) && (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar5 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) break;
    uVar3 = uVar3 * 0x10 + (int)cVar1 + iVar5;
    is->src_ = pcVar2 + 1;
    iVar4 = iVar4 + -1;
    pcVar2 = pcVar2 + 1;
    if (iVar4 == 0) {
      return uVar3;
    }
  }
  if (*(int *)(this + 0x30) == 0) {
    *(undefined4 *)(this + 0x30) = 8;
    *(size_t *)(this + 0x38) = escapeOffset;
    return 0;
  }
  __assert_fail("!HasParseError()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                ,0x396,
                "unsigned int rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseHex4(InputStream &, size_t) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>]"
               );
}

Assistant:

unsigned ParseHex4(InputStream& is, size_t escapeOffset) {
        unsigned codepoint = 0;
        for (int i = 0; i < 4; i++) {
            Ch c = is.Peek();
            codepoint <<= 4;
            codepoint += static_cast<unsigned>(c);
            if (c >= '0' && c <= '9')
                codepoint -= '0';
            else if (c >= 'A' && c <= 'F')
                codepoint -= 'A' - 10;
            else if (c >= 'a' && c <= 'f')
                codepoint -= 'a' - 10;
            else {
                RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, escapeOffset);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
            }
            is.Take();
        }
        return codepoint;
    }